

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue.h
# Opt level: O1

vector<char_data_*,_std::allocator<char_data_*>_> * __thiscall
CQueue::GetCharacterData<char_data*&,char_const(&)[51]>
          (vector<char_data_*,_std::allocator<char_data_*>_> *__return_storage_ptr__,CQueue *this,
          tuple<char_data_*&,_const_char_(&)[51]> *t)

{
  vector<char_data_*,_std::allocator<char_data_*>_> *local_18;
  
  (__return_storage_ptr__->super__Vector_base<char_data_*,_std::allocator<char_data_*>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<char_data_*,_std::allocator<char_data_*>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<char_data_*,_std::allocator<char_data_*>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_18 = __return_storage_ptr__;
  std::
  __apply_impl<CQueue::GetCharacterData<char_data*&,char_const(&)[51]>(std::tuple<char_data*&,char_const(&)[51]>&)::_lambda((auto:1_const&)___)_1_,std::tuple<char_data*&,char_const(&)[51]>&,0ul,1ul>
            (&local_18,t);
  return __return_storage_ptr__;
}

Assistant:

std::vector<CHAR_DATA*> GetCharacterData(std::tuple<Tp...>& t)
	{
		std::vector<CHAR_DATA*> accumulator;

		std::apply([&] (const auto&... tupleArgs) 
		{
			auto processTuple = [&](const auto& x)
			{
				// decay x to get the actual argument type to compare to our character data type 
		 		if constexpr (std::is_same<typename std::decay<decltype(x)>::type,CHAR_DATA*>::value)
					accumulator.push_back(x);
			};
			(processTuple(tupleArgs), ...);  // fold expression - calls processTuple for each argument in tupleArgs
		}, t);

		return accumulator;
	}